

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void filter_src_pixels_vertical(__m128i *tmp,__m128i *coeffs,__m128i *res_lo,__m128i *res_hi,int k)

{
  __m128i *palVar1;
  __m128i *palVar2;
  __m128i *palVar3;
  __m128i *palVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i alVar7;
  __m128i alVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  lVar9 = (long)k;
  alVar5 = tmp[lVar9 + 4];
  palVar1 = tmp + lVar9 + 5;
  alVar6 = tmp[lVar9 + 6];
  palVar2 = tmp + lVar9 + 7;
  auVar24._0_12_ = alVar5._0_12_;
  auVar24._12_2_ = alVar5[0]._6_2_;
  auVar24._14_2_ = *(undefined2 *)((long)*palVar1 + 6);
  auVar18._12_4_ = auVar24._12_4_;
  auVar18._0_10_ = alVar5._0_10_;
  auVar18._10_2_ = *(undefined2 *)((long)*palVar1 + 4);
  auVar19._10_6_ = auVar18._10_6_;
  auVar19._0_8_ = alVar5[0];
  auVar19._8_2_ = alVar5[0]._4_2_;
  auVar17._8_8_ = auVar19._8_8_;
  auVar17._6_2_ = *(undefined2 *)((long)*palVar1 + 2);
  auVar17._4_2_ = alVar5[0]._2_2_;
  auVar17._0_2_ = (undefined2)alVar5[0];
  auVar17._2_2_ = (short)(*palVar1)[0];
  auVar23._0_12_ = alVar6._0_12_;
  auVar23._12_2_ = alVar6[0]._6_2_;
  auVar23._14_2_ = *(undefined2 *)((long)*palVar2 + 6);
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = alVar6._0_10_;
  auVar22._10_2_ = *(undefined2 *)((long)*palVar2 + 4);
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = alVar6[0];
  auVar21._8_2_ = alVar6[0]._4_2_;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = *(undefined2 *)((long)*palVar2 + 2);
  auVar20._4_2_ = alVar6[0]._2_2_;
  auVar20._0_2_ = (undefined2)alVar6[0];
  auVar20._2_2_ = (short)(*palVar2)[0];
  alVar7 = tmp[lVar9 + 8];
  palVar3 = tmp + lVar9 + 9;
  auVar28._0_12_ = alVar7._0_12_;
  auVar28._12_2_ = alVar7[0]._6_2_;
  auVar28._14_2_ = *(undefined2 *)((long)*palVar3 + 6);
  auVar27._12_4_ = auVar28._12_4_;
  auVar27._0_10_ = alVar7._0_10_;
  auVar27._10_2_ = *(undefined2 *)((long)*palVar3 + 4);
  auVar26._10_6_ = auVar27._10_6_;
  auVar26._0_8_ = alVar7[0];
  auVar26._8_2_ = alVar7[0]._4_2_;
  auVar25._8_8_ = auVar26._8_8_;
  auVar25._6_2_ = *(undefined2 *)((long)*palVar3 + 2);
  auVar25._4_2_ = alVar7[0]._2_2_;
  auVar25._0_2_ = (undefined2)alVar7[0];
  auVar25._2_2_ = (short)(*palVar3)[0];
  alVar8 = tmp[lVar9 + 10];
  palVar4 = tmp + lVar9 + 0xb;
  auVar19 = pmaddwd(auVar17,(undefined1  [16])*coeffs);
  auVar24 = pmaddwd(auVar20,(undefined1  [16])coeffs[1]);
  auVar13._0_12_ = alVar8._0_12_;
  auVar13._12_2_ = alVar8[0]._6_2_;
  auVar13._14_2_ = *(undefined2 *)((long)*palVar4 + 6);
  auVar29._12_4_ = auVar13._12_4_;
  auVar29._0_10_ = alVar8._0_10_;
  auVar29._10_2_ = *(undefined2 *)((long)*palVar4 + 4);
  auVar16._10_6_ = auVar29._10_6_;
  auVar16._0_8_ = alVar8[0];
  auVar16._8_2_ = alVar8[0]._4_2_;
  auVar14._8_8_ = auVar16._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)*palVar4 + 2);
  auVar14._4_2_ = alVar8[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar8[0];
  auVar14._2_2_ = (short)(*palVar4)[0];
  auVar29 = pmaddwd(auVar25,(undefined1  [16])coeffs[2]);
  auVar14 = pmaddwd(auVar14,(undefined1  [16])coeffs[3]);
  auVar11._2_2_ = (short)(*palVar1)[1];
  auVar11._0_2_ = (short)alVar5[1];
  auVar11._4_2_ = alVar5[1]._2_2_;
  auVar11._6_2_ = *(undefined2 *)((long)*palVar1 + 10);
  auVar11._8_2_ = alVar5[1]._4_2_;
  auVar11._10_2_ = *(undefined2 *)((long)*palVar1 + 0xc);
  auVar11._12_2_ = alVar5[1]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)*palVar1 + 0xe);
  auVar10._2_2_ = (short)(*palVar2)[1];
  auVar10._0_2_ = (short)alVar6[1];
  auVar10._4_2_ = alVar6[1]._2_2_;
  auVar10._6_2_ = *(undefined2 *)((long)*palVar2 + 10);
  auVar10._8_2_ = alVar6[1]._4_2_;
  auVar10._10_2_ = *(undefined2 *)((long)*palVar2 + 0xc);
  auVar10._12_2_ = alVar6[1]._6_2_;
  auVar10._14_2_ = *(undefined2 *)((long)*palVar2 + 0xe);
  auVar15._2_2_ = (short)(*palVar3)[1];
  auVar15._0_2_ = (short)alVar7[1];
  auVar15._4_2_ = alVar7[1]._2_2_;
  auVar15._6_2_ = *(undefined2 *)((long)*palVar3 + 10);
  auVar15._8_2_ = alVar7[1]._4_2_;
  auVar15._10_2_ = *(undefined2 *)((long)*palVar3 + 0xc);
  auVar15._12_2_ = alVar7[1]._6_2_;
  auVar15._14_2_ = *(undefined2 *)((long)*palVar3 + 0xe);
  auVar12._2_2_ = (short)(*palVar4)[1];
  auVar12._0_2_ = (short)alVar8[1];
  auVar12._4_2_ = alVar8[1]._2_2_;
  auVar12._6_2_ = *(undefined2 *)((long)*palVar4 + 10);
  auVar12._8_2_ = alVar8[1]._4_2_;
  auVar12._10_2_ = *(undefined2 *)((long)*palVar4 + 0xc);
  auVar12._12_2_ = alVar8[1]._6_2_;
  auVar12._14_2_ = *(undefined2 *)((long)*palVar4 + 0xe);
  auVar11 = pmaddwd(auVar11,(undefined1  [16])coeffs[4]);
  auVar10 = pmaddwd(auVar10,(undefined1  [16])coeffs[5]);
  auVar16 = pmaddwd(auVar15,(undefined1  [16])coeffs[6]);
  auVar12 = pmaddwd(auVar12,(undefined1  [16])coeffs[7]);
  (*res_lo)[0] = CONCAT44(auVar12._0_4_ + auVar16._0_4_ + auVar10._0_4_ + auVar11._0_4_,
                          auVar14._0_4_ + auVar29._0_4_ + auVar24._0_4_ + auVar19._0_4_);
  *(int *)res_lo[1] = auVar14._4_4_ + auVar29._4_4_ + auVar24._4_4_ + auVar19._4_4_;
  *(int *)((long)res_lo[1] + 4) = auVar12._4_4_ + auVar16._4_4_ + auVar10._4_4_ + auVar11._4_4_;
  *(int *)*res_hi = auVar14._8_4_ + auVar29._8_4_ + auVar24._8_4_ + auVar19._8_4_;
  *(int *)((long)*res_hi + 4) = auVar12._8_4_ + auVar16._8_4_ + auVar10._8_4_ + auVar11._8_4_;
  *(int *)(*res_hi + 1) = auVar14._12_4_ + auVar29._12_4_ + auVar24._12_4_ + auVar19._12_4_;
  *(int *)((long)*res_hi + 0xc) = auVar12._12_4_ + auVar16._12_4_ + auVar10._12_4_ + auVar11._12_4_;
  return;
}

Assistant:

static inline void filter_src_pixels_vertical(__m128i *tmp, __m128i *coeffs,
                                              __m128i *res_lo, __m128i *res_hi,
                                              int k) {
  // Load from tmp and rearrange pairs of consecutive rows into the
  // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
  const __m128i *src = tmp + (k + 4);
  const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
  const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
  const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
  const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

  const __m128i res_0 = _mm_madd_epi16(src_0, coeffs[0]);
  const __m128i res_2 = _mm_madd_epi16(src_2, coeffs[1]);
  const __m128i res_4 = _mm_madd_epi16(src_4, coeffs[2]);
  const __m128i res_6 = _mm_madd_epi16(src_6, coeffs[3]);

  const __m128i res_even =
      _mm_add_epi32(_mm_add_epi32(res_0, res_2), _mm_add_epi32(res_4, res_6));

  // Filter odd-index pixels
  const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
  const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
  const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
  const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

  const __m128i res_1 = _mm_madd_epi16(src_1, coeffs[4]);
  const __m128i res_3 = _mm_madd_epi16(src_3, coeffs[5]);
  const __m128i res_5 = _mm_madd_epi16(src_5, coeffs[6]);
  const __m128i res_7 = _mm_madd_epi16(src_7, coeffs[7]);

  const __m128i res_odd =
      _mm_add_epi32(_mm_add_epi32(res_1, res_3), _mm_add_epi32(res_5, res_7));

  // Rearrange pixels back into the order 0 ... 7
  *res_lo = _mm_unpacklo_epi32(res_even, res_odd);
  *res_hi = _mm_unpackhi_epi32(res_even, res_odd);
}